

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sDrawTests.cpp
# Opt level: O2

int __thiscall deqp::gles3::Stress::DrawTests::init(DrawTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int extraout_EAX;
  TestNode *node;
  TestNode *node_00;
  TestCaseGroup *pTVar2;
  DrawInvalidRangeCase *pDVar3;
  DrawMethod method;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  long lVar5;
  undefined1 useLimitMax;
  string desc;
  string name;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "unaligned_data","Test with unaligned data");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "draw_range_elements","Test drawRangeElements");
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  uVar4 = extraout_RDX;
  for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 4) {
    uVar1 = *(uint *)((long)&DAT_01880ce0 + lVar5);
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              (&name,(DrawTestSpec *)(ulong)uVar1,(DrawMethod)uVar4);
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              (&desc,(DrawTestSpec *)(ulong)uVar1,method);
    pTVar2 = (TestCaseGroup *)operator_new(0x80);
    TestCaseGroup::TestCaseGroup
              (pTVar2,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
               desc._M_dataplus._M_p);
    (pTVar2->super_TestCaseGroup).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e4c350;
    *(uint *)&pTVar2[1].super_TestCaseGroup.super_TestNode._vptr_TestNode = uVar1;
    tcu::TestNode::addChild(node,(TestNode *)pTVar2);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&name);
    uVar4 = extraout_RDX_00;
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"random","random draw commands.");
  (pTVar2->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e4c3f0;
  tcu::TestNode::addChild(node,(TestNode *)pTVar2);
  useLimitMax = SUB81(node,0);
  pDVar3 = (DrawInvalidRangeCase *)operator_new(0xa0);
  Stress::anon_unknown_0::DrawInvalidRangeCase::DrawInvalidRangeCase
            (pDVar3,(this->super_TestCaseGroup).m_context,"range_max_over_bounds",(char *)0x0,
             0x210000,0,false,(bool)useLimitMax);
  tcu::TestNode::addChild(node_00,(TestNode *)pDVar3);
  pDVar3 = (DrawInvalidRangeCase *)operator_new(0xa0);
  Stress::anon_unknown_0::DrawInvalidRangeCase::DrawInvalidRangeCase
            (pDVar3,(this->super_TestCaseGroup).m_context,"range_max_over_bounds_near_signed_wrap",
             (char *)0x0,0x7fffffff,0,false,(bool)useLimitMax);
  tcu::TestNode::addChild(node_00,(TestNode *)pDVar3);
  pDVar3 = (DrawInvalidRangeCase *)operator_new(0xa0);
  Stress::anon_unknown_0::DrawInvalidRangeCase::DrawInvalidRangeCase
            (pDVar3,(this->super_TestCaseGroup).m_context,"range_max_over_bounds_near_unsigned_wrap"
             ,(char *)0x0,0xffffffff,0,false,(bool)useLimitMax);
  tcu::TestNode::addChild(node_00,(TestNode *)pDVar3);
  pDVar3 = (DrawInvalidRangeCase *)operator_new(0xa0);
  Stress::anon_unknown_0::DrawInvalidRangeCase::DrawInvalidRangeCase
            (pDVar3,(this->super_TestCaseGroup).m_context,"range_max_over_bounds_near_max",
             (char *)0x0,0,0,true,(bool)useLimitMax);
  tcu::TestNode::addChild(node_00,(TestNode *)pDVar3);
  pDVar3 = (DrawInvalidRangeCase *)operator_new(0xa0);
  Stress::anon_unknown_0::DrawInvalidRangeCase::DrawInvalidRangeCase
            (pDVar3,(this->super_TestCaseGroup).m_context,"range_min_max_over_bounds",
             (char *)&__DT_SYMTAB[0x6670].st_value,0x210000,0,false,(bool)useLimitMax);
  tcu::TestNode::addChild(node_00,(TestNode *)pDVar3);
  pDVar3 = (DrawInvalidRangeCase *)operator_new(0xa0);
  Stress::anon_unknown_0::DrawInvalidRangeCase::DrawInvalidRangeCase
            (pDVar3,(this->super_TestCaseGroup).m_context,
             "range_min_max_over_bounds_near_signed_wrap",(char *)0x7ffffff0,0x7fffffff,0,false,
             (bool)useLimitMax);
  tcu::TestNode::addChild(node_00,(TestNode *)pDVar3);
  pDVar3 = (DrawInvalidRangeCase *)operator_new(0xa0);
  Stress::anon_unknown_0::DrawInvalidRangeCase::DrawInvalidRangeCase
            (pDVar3,(this->super_TestCaseGroup).m_context,
             "range_min_max_over_bounds_near_unsigned_wrap",&DAT_fffffffffffffff0,0xffffffff,0,false
             ,(bool)useLimitMax);
  tcu::TestNode::addChild(node_00,(TestNode *)pDVar3);
  pDVar3 = (DrawInvalidRangeCase *)operator_new(0xa0);
  Stress::anon_unknown_0::DrawInvalidRangeCase::DrawInvalidRangeCase
            (pDVar3,(this->super_TestCaseGroup).m_context,"range_min_max_over_bounds_near_max",
             (char *)0x0,0,1,true,(bool)useLimitMax);
  tcu::TestNode::addChild(node_00,(TestNode *)pDVar3);
  return extraout_EAX;
}

Assistant:

void DrawTests::init (void)
{
	tcu::TestCaseGroup* const unalignedGroup	= new tcu::TestCaseGroup(m_testCtx, "unaligned_data", "Test with unaligned data");
	tcu::TestCaseGroup* const drawRangeGroup	= new tcu::TestCaseGroup(m_testCtx, "draw_range_elements", "Test drawRangeElements");

	addChild(unalignedGroup);
	addChild(drawRangeGroup);

	// .unaligned_data
	{
		const gls::DrawTestSpec::DrawMethod basicMethods[] =
		{
			// gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS,
			gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS,
			// gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INSTANCED,
			gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED,
			gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED,
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(basicMethods); ++ndx)
		{
			const std::string name = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);
			const std::string desc = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);

			unalignedGroup->addChild(new MethodGroup(m_context, name.c_str(), desc.c_str(), basicMethods[ndx]));
		}

		// Random

		unalignedGroup->addChild(new RandomGroup(m_context, "random", "random draw commands."));
	}

	// .draw_range_elements
	{
		// use a larger range than the buffer size is
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_max_over_bounds",							"Range over buffer bounds",	0x00000000,	0x00210000));
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_max_over_bounds_near_signed_wrap",			"Range over buffer bounds",	0x00000000,	0x7FFFFFFF));
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_max_over_bounds_near_unsigned_wrap",		"Range over buffer bounds",	0x00000000,	0xFFFFFFFF));
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_max_over_bounds_near_max",					"Range over buffer bounds",	0x00000000, 0x00000000, false, true));

		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_min_max_over_bounds",						"Range over buffer bounds",	0x00200000,	0x00210000));
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_min_max_over_bounds_near_signed_wrap",		"Range over buffer bounds",	0x7FFFFFF0,	0x7FFFFFFF));
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_min_max_over_bounds_near_unsigned_wrap",	"Range over buffer bounds",	0xFFFFFFF0,	0xFFFFFFFF));
		drawRangeGroup->addChild(new DrawInvalidRangeCase(m_context, "range_min_max_over_bounds_near_max",				"Range over buffer bounds",	0x00000000, 0x00000000, true, true));
	}
}